

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lddmc.c
# Opt level: O1

void print_example(MDD example)

{
  uint uVar1;
  long lVar2;
  long lVar3;
  undefined8 uStack_30;
  
  if (example != 0) {
    lVar2 = -((ulong)(uint)vector_size * 4 + 0xf & 0xfffffffffffffff0);
    *(undefined8 *)((long)&uStack_30 + lVar2) = 0x105c26;
    lddmc_sat_one(example,(uint32_t *)(&stack0xffffffffffffffd8 + lVar2),(long)vector_size);
    *(undefined8 *)((long)&uStack_30 + lVar2) = 0x105c30;
    putchar(0x5b);
    if (0 < vector_size) {
      lVar3 = 0;
      do {
        if (lVar3 != 0) {
          *(undefined8 *)((long)&uStack_30 + lVar2) = 0x105c52;
          putchar(0x2c);
        }
        uVar1 = *(uint *)((long)(&stack0xffffffffffffffd8 + lVar2) + lVar3 * 4);
        *(undefined8 *)((long)&uStack_30 + lVar2) = 0x105c60;
        printf("%u",(ulong)uVar1);
        lVar3 = lVar3 + 1;
      } while (lVar3 < vector_size);
    }
    *(undefined8 *)((long)&uStack_30 + lVar2) = 0x105c79;
    putchar(0x5d);
  }
  return;
}

Assistant:

static void
print_example(MDD example)
{
    if (example != lddmc_false) {
        uint32_t vec[vector_size];
        lddmc_sat_one(example, vec, vector_size);

        printf("[");
        for (int i=0; i<vector_size; i++) {
            if (i>0) printf(",");
            printf("%" PRIu32, vec[i]);
        }
        printf("]");
    }
}